

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2ThreadTest::DestroySurface::DestroySurface
          (DestroySurface *this,EGLDisplay display,
          SharedPtr<deqp::egl::GLES2ThreadTest::Surface> *surface)

{
  SharedPtr<tcu::ThreadUtil::Object> local_28;
  
  tcu::ThreadUtil::Operation::Operation(&this->super_Operation,"DestroySurface");
  (this->super_Operation)._vptr_Operation = (_func_int **)&PTR__DestroySurface_01e00318;
  this->m_display = display;
  de::SharedPtr<deqp::egl::GLES2ThreadTest::Surface>::SharedPtr(&this->m_surface,surface);
  local_28.m_ptr = &((this->m_surface).m_ptr)->super_Object;
  local_28.m_state = (this->m_surface).m_state;
  if (local_28.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_28.m_state)->strongRefCount = (local_28.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_28.m_state)->weakRefCount = (local_28.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  tcu::ThreadUtil::Operation::modifyObject(&this->super_Operation,&local_28);
  de::SharedPtr<tcu::ThreadUtil::Object>::release(&local_28);
  return;
}

Assistant:

DestroySurface::DestroySurface (EGLDisplay display, SharedPtr<Surface> surface)
	: tcu::ThreadUtil::Operation	("DestroySurface")
	, m_display					(display)
	, m_surface					(surface)
{
	modifyObject(SharedPtr<tcu::ThreadUtil::Object>(m_surface));
}